

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  pointer *pppEVar1;
  UnitTestImpl *pUVar2;
  iterator __position;
  Environment *pEVar3;
  long in_FS_OFFSET;
  Environment *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = env;
  if (env == (Environment *)0x0) {
    pEVar3 = (Environment *)0x0;
  }
  else {
    pUVar2 = this->impl_;
    __position._M_current =
         (pUVar2->environments_).
         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pUVar2->environments_).
        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<testing::Environment*,std::allocator<testing::Environment*>>::
      _M_realloc_insert<testing::Environment*const&>
                ((vector<testing::Environment*,std::allocator<testing::Environment*>> *)
                 &pUVar2->environments_,__position,&local_10);
      pEVar3 = local_10;
    }
    else {
      *__position._M_current = env;
      pppEVar1 = &(pUVar2->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
      pEVar3 = env;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pEVar3;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == NULL) {
    return NULL;
  }

  impl_->environments().push_back(env);
  return env;
}